

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O3

void __thiscall so_5::impl::disp_repository_t::start(disp_repository_t *this)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  
  LOCK();
  bVar2 = (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
  if (bVar2) {
    (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
  }
  UNLOCK();
  if (bVar2) {
LAB_00215c8c:
    if (this->m_state == not_started) {
      for (p_Var1 = (this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var1 !=
          &(this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header;
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
        (**(code **)(**(long **)(p_Var1 + 2) + 0x28))(*(long **)(p_Var1 + 2),p_Var1 + 1);
        (**(code **)(**(long **)(p_Var1 + 2) + 0x10))(*(long **)(p_Var1 + 2),this->m_env);
      }
      this->m_state = started;
    }
    LOCK();
    (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i =
         (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    return;
  }
  do {
    if ((this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0) {
      LOCK();
      bVar2 = (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
      if (bVar2) {
        (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
      }
      UNLOCK();
      if (bVar2) goto LAB_00215c8c;
    }
    sched_yield();
  } while( true );
}

Assistant:

void
disp_repository_t::start()
{
	std::lock_guard< default_rw_spinlock_t > lock( m_lock );
	if( state_t::not_started == m_state )
	{
		auto it = m_named_dispatcher_map.begin();
		auto it_end = m_named_dispatcher_map.end();

		for( ; it != it_end; ++it )
		{
			it->second->set_data_sources_name_base( it->first );
			it->second->start( m_env );
		}

		m_state = state_t::started;
	}
}